

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

void Gia_ManPrintCo_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint *puVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  
  uVar2 = *(ulong *)pObj & 0x1fffffff;
  if (uVar2 != 0x1fffffff && -1 < (int)*(ulong *)pObj) {
    Gia_ManPrintCo_rec(p,pObj + -uVar2);
    Gia_ManPrintCo_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
    pGVar5 = p->pObjs;
    if ((pObj < pGVar5) || (pGVar5 + p->nObjs <= pObj)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    puVar1 = p->pMuxes;
    if ((puVar1 != (uint *)0x0) &&
       (iVar4 = (int)((ulong)((long)pObj - (long)pGVar5) >> 2), puVar1[iVar4 * -0x55555555] != 0)) {
      if (puVar1 == (uint *)0x0) {
        pGVar5 = (Gia_Obj_t *)0x0;
      }
      else {
        if ((int)puVar1[iVar4 * -0x55555555] < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar3 = puVar1[iVar4 * -0x55555555] >> 1;
        if (p->nObjs <= (int)uVar3) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar5 = pGVar5 + uVar3;
      }
      Gia_ManPrintCo_rec(p,pGVar5);
    }
  }
  Gia_ObjPrint(p,pObj);
  return;
}

Assistant:

void Gia_ManPrintCo_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManPrintCo_rec( p, Gia_ObjFanin0(pObj) );
        Gia_ManPrintCo_rec( p, Gia_ObjFanin1(pObj) );
        if ( Gia_ObjIsMux(p, pObj) )
            Gia_ManPrintCo_rec( p, Gia_ObjFanin2(p, pObj) );
    }
    Gia_ObjPrint( p, pObj );
}